

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_test.cpp
# Opt level: O0

bool __thiscall
ReplayInterface::enqueue_create_render_pass2
          (ReplayInterface *this,Hash hash,VkRenderPassCreateInfo2 *create_info,
          VkRenderPass *render_pass)

{
  bool bVar1;
  VkRenderPass_T *pVVar2;
  VkRenderPassCreateInfo2 *local_38;
  Hash recorded_hash;
  VkRenderPass *render_pass_local;
  VkRenderPassCreateInfo2 *create_info_local;
  Hash hash_local;
  ReplayInterface *this_local;
  
  recorded_hash = (Hash)render_pass;
  render_pass_local = (VkRenderPass *)create_info;
  create_info_local = (VkRenderPassCreateInfo2 *)hash;
  hash_local = (Hash)this;
  bVar1 = Fossilize::Hashing::compute_hash_render_pass2(create_info,(Hash *)&local_38);
  if (bVar1) {
    if (local_38 == create_info_local) {
      pVVar2 = fake_handle<VkRenderPass_T*>((uint64_t)create_info_local);
      *(VkRenderPass_T **)recorded_hash = pVVar2;
      this_local._7_1_ =
           Fossilize::StateRecorder::record_render_pass2
                     (&this->recorder,*(VkRenderPass *)recorded_hash,
                      (VkRenderPassCreateInfo2 *)render_pass_local,0);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool enqueue_create_render_pass2(Hash hash, const VkRenderPassCreateInfo2 *create_info, VkRenderPass *render_pass) override
	{
		Hash recorded_hash;
		if (!Hashing::compute_hash_render_pass2(*create_info, &recorded_hash))
			return false;
		if (recorded_hash != hash)
			return false;

		*render_pass = fake_handle<VkRenderPass>(hash);
		return recorder.record_render_pass2(*render_pass, *create_info);
	}